

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O3

RunResult __thiscall
wabt::interp::Thread::DoSimdBitmask<wabt::interp::Simd<signed_char,(unsigned_char)16>>(Thread *this)

{
  ulong uVar1;
  undefined4 uVar2;
  undefined6 uVar3;
  undefined1 auVar4 [12];
  undefined1 auVar5 [12];
  short sVar6;
  undefined1 auVar7 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar12 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  char cVar21;
  char cVar26;
  char cVar27;
  char cVar28;
  undefined1 auVar22 [16];
  Value VVar29;
  undefined1 auVar8 [16];
  undefined2 uVar11;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  
  VVar29 = Pop(this);
  cVar21 = -(VVar29.field_0._0_1_ < '\0');
  cVar26 = -(VVar29.field_0._1_1_ < '\0');
  cVar27 = -(VVar29.field_0._2_1_ < '\0');
  cVar28 = -(VVar29.field_0._3_1_ < '\0');
  uVar11 = CONCAT11(cVar28,cVar28);
  uVar2 = CONCAT31(CONCAT21(uVar11,cVar27),cVar27);
  uVar3 = CONCAT51(CONCAT41(uVar2,cVar26),cVar26);
  auVar22._0_2_ = CONCAT11(cVar21,cVar21);
  uVar1 = CONCAT62(uVar3,auVar22._0_2_);
  auVar25._8_4_ = 0;
  auVar25._0_8_ = uVar1;
  auVar25._12_2_ = uVar11;
  auVar25._14_2_ = uVar11;
  uVar11 = (undefined2)uVar2;
  auVar24._12_4_ = auVar25._12_4_;
  auVar24._8_2_ = 0;
  auVar24._0_8_ = uVar1;
  auVar24._10_2_ = uVar11;
  auVar23._10_6_ = auVar24._10_6_;
  auVar23._8_2_ = uVar11;
  auVar23._0_8_ = uVar1;
  uVar11 = (undefined2)uVar3;
  auVar22._8_8_ = auVar23._8_8_;
  auVar22._6_2_ = uVar11;
  auVar22._4_2_ = uVar11;
  auVar22._2_2_ = auVar22._0_2_;
  cVar21 = -(VVar29.field_0._4_1_ < '\0');
  cVar26 = -(VVar29.field_0._5_1_ < '\0');
  cVar27 = -(VVar29.field_0._6_1_ < '\0');
  cVar28 = -(VVar29.field_0._7_1_ < '\0');
  uVar11 = CONCAT11(cVar28,cVar28);
  uVar2 = CONCAT31(CONCAT21(uVar11,cVar27),cVar27);
  uVar3 = CONCAT51(CONCAT41(uVar2,cVar26),cVar26);
  auVar17._0_2_ = CONCAT11(cVar21,cVar21);
  uVar1 = CONCAT62(uVar3,auVar17._0_2_);
  auVar20._8_4_ = 0;
  auVar20._0_8_ = uVar1;
  auVar20._12_2_ = uVar11;
  auVar20._14_2_ = uVar11;
  uVar11 = (undefined2)uVar2;
  auVar19._12_4_ = auVar20._12_4_;
  auVar19._8_2_ = 0;
  auVar19._0_8_ = uVar1;
  auVar19._10_2_ = uVar11;
  auVar18._10_6_ = auVar19._10_6_;
  auVar18._8_2_ = uVar11;
  auVar18._0_8_ = uVar1;
  uVar11 = (undefined2)uVar3;
  auVar17._8_8_ = auVar18._8_8_;
  auVar17._6_2_ = uVar11;
  auVar17._4_2_ = uVar11;
  auVar17._2_2_ = auVar17._0_2_;
  uVar11 = CONCAT11(VVar29.field_0._11_1_,VVar29.field_0._11_1_);
  uVar2 = CONCAT31(CONCAT21(uVar11,VVar29.field_0._10_1_),VVar29.field_0._10_1_);
  uVar3 = CONCAT51(CONCAT41(uVar2,VVar29.field_0._9_1_),VVar29.field_0._9_1_);
  sVar6 = CONCAT11(VVar29.field_0._8_1_,VVar29.field_0._8_1_);
  uVar1 = CONCAT62(uVar3,sVar6);
  auVar14._8_4_ = 0;
  auVar14._0_8_ = uVar1;
  auVar14._12_2_ = uVar11;
  auVar14._14_2_ = uVar11;
  uVar11 = (undefined2)uVar2;
  auVar13._12_4_ = auVar14._12_4_;
  auVar13._8_2_ = 0;
  auVar13._0_8_ = uVar1;
  auVar13._10_2_ = uVar11;
  auVar12._10_6_ = auVar13._10_6_;
  auVar12._8_2_ = uVar11;
  auVar12._0_8_ = uVar1;
  uVar11 = (undefined2)uVar3;
  auVar4._4_8_ = auVar12._8_8_;
  auVar4._2_2_ = uVar11;
  auVar4._0_2_ = uVar11;
  auVar15._0_4_ = (int)sVar6 >> 8;
  auVar15._4_4_ = auVar4._0_4_ >> 0x18;
  auVar15._8_4_ = auVar12._8_4_ >> 0x18;
  auVar15._12_4_ = auVar13._12_4_ >> 0x18;
  uVar11 = CONCAT11(VVar29.field_0._15_1_,VVar29.field_0._15_1_);
  uVar2 = CONCAT31(CONCAT21(uVar11,VVar29.field_0._14_1_),VVar29.field_0._14_1_);
  uVar3 = CONCAT51(CONCAT41(uVar2,VVar29.field_0._13_1_),VVar29.field_0._13_1_);
  sVar6 = CONCAT11(VVar29.field_0._12_1_,VVar29.field_0._12_1_);
  uVar1 = CONCAT62(uVar3,sVar6);
  auVar8._8_4_ = 0;
  auVar8._0_8_ = uVar1;
  auVar8._12_2_ = uVar11;
  auVar8._14_2_ = uVar11;
  uVar11 = (undefined2)uVar2;
  auVar7._12_4_ = auVar8._12_4_;
  auVar7._8_2_ = 0;
  auVar7._0_8_ = uVar1;
  auVar7._10_2_ = uVar11;
  auVar10._10_6_ = auVar7._10_6_;
  auVar10._8_2_ = uVar11;
  auVar10._0_8_ = uVar1;
  uVar11 = (undefined2)uVar3;
  auVar5._4_8_ = auVar10._8_8_;
  auVar5._2_2_ = uVar11;
  auVar5._0_2_ = uVar11;
  auVar9._0_4_ = (int)sVar6 >> 8;
  auVar9._4_4_ = auVar5._0_4_ >> 0x18;
  auVar9._8_4_ = auVar10._8_4_ >> 0x18;
  auVar9._12_4_ = auVar7._12_4_ >> 0x18;
  auVar10 = auVar9 & _DAT_001fc330 |
            auVar15 & _DAT_001fc320 | auVar22 & _DAT_001fc300 | auVar17 & _DAT_001fc310;
  auVar16._0_8_ = auVar10._8_8_;
  auVar16._8_4_ = auVar10._8_4_;
  auVar16._12_4_ = auVar10._12_4_;
  Push(this,(Value)ZEXT416(SUB164(auVar16 | auVar10,4) | SUB164(auVar16 | auVar10,0)));
  return Ok;
}

Assistant:

RunResult Thread::DoSimdBitmask() {
  auto val = Pop<S>();
  u32 result = 0;
  for (u8 i = 0; i < S::lanes; ++i) {
    if (val[i] < 0) {
      result |= 1 << i;
    }
  }
  Push(result);
  return RunResult::Ok;
}